

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O1

void __thiscall FIX::FieldBase::swap(FieldBase *this,FieldBase *rhs)

{
  int iVar1;
  field_metrics fVar2;
  
  iVar1 = this->m_tag;
  this->m_tag = rhs->m_tag;
  rhs->m_tag = iVar1;
  fVar2 = this->m_metrics;
  this->m_metrics = rhs->m_metrics;
  rhs->m_metrics = fVar2;
  std::__cxx11::string::swap((string *)&this->m_string);
  std::__cxx11::string::swap((string *)&this->m_data);
  return;
}

Assistant:

void swap(FieldBase &rhs) {
    std::swap(m_tag, rhs.m_tag);
    std::swap(m_metrics, rhs.m_metrics);
    m_string.swap(rhs.m_string);
    m_data.swap(rhs.m_data);
  }